

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O0

UBool icu_63::RegexPattern::matches
                (UnicodeString *regex,UnicodeString *input,UParseError *pe,UErrorCode *status)

{
  UBool UVar1;
  RegexPattern *this;
  RegexMatcher *this_00;
  RegexMatcher *matcher;
  RegexPattern *pat;
  UBool retVal;
  UErrorCode *status_local;
  UParseError *pe_local;
  UnicodeString *input_local;
  UnicodeString *regex_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this = compile(regex,0,pe,status);
    this_00 = RegexPattern::matcher(this,input,status);
    regex_local._7_1_ = RegexMatcher::matches(this_00,status);
    if (this_00 != (RegexMatcher *)0x0) {
      RegexMatcher::~RegexMatcher(this_00);
      UMemory::operator_delete((UMemory *)this_00,status);
    }
    if (this != (RegexPattern *)0x0) {
      ~RegexPattern(this);
      UMemory::operator_delete((UMemory *)this,status);
    }
  }
  else {
    regex_local._7_1_ = '\0';
  }
  return regex_local._7_1_;
}

Assistant:

UBool U_EXPORT2 RegexPattern::matches(const UnicodeString   &regex,
              const UnicodeString   &input,
                    UParseError     &pe,
                    UErrorCode      &status) {

    if (U_FAILURE(status)) {return FALSE;}

    UBool         retVal;
    RegexPattern *pat     = NULL;
    RegexMatcher *matcher = NULL;

    pat     = RegexPattern::compile(regex, 0, pe, status);
    matcher = pat->matcher(input, status);
    retVal  = matcher->matches(status);

    delete matcher;
    delete pat;
    return retVal;
}